

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O2

int run_test_get_osfhandle_valid_handle(void)

{
  int iVar1;
  uv_os_fd_t uVar2;
  uv_loop_t *puVar3;
  undefined8 uVar4;
  char *pcVar5;
  
  unlink("test_file");
  loop = uv_default_loop();
  iVar1 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file",0x42,0x180,(uv_fs_cb)0x0);
  if (iVar1 < 0) {
    pcVar5 = "r >= 0";
    uVar4 = 0xe2b;
  }
  else if (open_req1.result._4_4_ < 0) {
    pcVar5 = "open_req1.result >= 0";
    uVar4 = 0xe2c;
  }
  else {
    uv_fs_req_cleanup(&open_req1);
    uVar2 = uv_get_osfhandle((int)open_req1.result);
    if (uVar2 < 0) {
      pcVar5 = "fd >= 0";
      uVar4 = 0xe33;
    }
    else {
      iVar1 = uv_fs_close((uv_loop_t *)0x0,&close_req,(int)open_req1.result,(uv_fs_cb)0x0);
      if (iVar1 == 0) {
        if (close_req.result == 0) {
          uv_fs_req_cleanup(&close_req);
          unlink("test_file");
          puVar3 = uv_default_loop();
          close_loop(puVar3);
          puVar3 = uv_default_loop();
          iVar1 = uv_loop_close(puVar3);
          if (iVar1 == 0) {
            return 0;
          }
          pcVar5 = "0 == uv_loop_close(uv_default_loop())";
          uVar4 = 0xe3e;
        }
        else {
          pcVar5 = "close_req.result == 0";
          uVar4 = 0xe38;
        }
      }
      else {
        pcVar5 = "r == 0";
        uVar4 = 0xe37;
      }
    }
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
          ,uVar4,pcVar5);
  abort();
}

Assistant:

TEST_IMPL(get_osfhandle_valid_handle) {
  int r;
  uv_os_fd_t fd;

  /* Setup. */
  unlink("test_file");

  loop = uv_default_loop();

  r = uv_fs_open(NULL,
                 &open_req1,
                 "test_file",
                 O_RDWR | O_CREAT,
                 S_IWUSR | S_IRUSR,
                 NULL);
  ASSERT(r >= 0);
  ASSERT(open_req1.result >= 0);
  uv_fs_req_cleanup(&open_req1);

  fd = uv_get_osfhandle(open_req1.result);
#ifdef _WIN32
  ASSERT(fd != INVALID_HANDLE_VALUE);
#else
  ASSERT(fd >= 0);
#endif

  r = uv_fs_close(NULL, &close_req, open_req1.result, NULL);
  ASSERT(r == 0);
  ASSERT(close_req.result == 0);
  uv_fs_req_cleanup(&close_req);

  /* Cleanup. */
  unlink("test_file");

  MAKE_VALGRIND_HAPPY();
  return 0;
}